

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

Spl_Man_t * Spl_ManAlloc(Gia_Man_t *pGia,int Limit,int fReverse)

{
  size_t __n;
  uint uVar1;
  Spl_Man_t *pSVar2;
  Vec_Bit_t *pVVar3;
  byte *__s;
  Vec_Bit_t *pVVar4;
  int *piVar5;
  int *__s_00;
  Vec_Int_t *pVVar6;
  Vec_Wec_t *pVVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  pSVar2 = (Spl_Man_t *)calloc(1,0x70);
  pSVar2->pGia = pGia;
  pSVar2->Limit = Limit;
  pSVar2->fReverse = fReverse;
  iVar8 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
  pVVar3 = (Vec_Bit_t *)malloc(0x10);
  pVVar3->nSize = 0;
  iVar10 = iVar8 * 0x20;
  pVVar3->nCap = iVar10;
  if (iVar8 == 0) {
    __s = (byte *)0x0;
  }
  else {
    __s = (byte *)malloc((long)iVar8 * 4);
  }
  pVVar3->pArray = (int *)__s;
  pVVar3->nSize = iVar10;
  __n = (long)iVar8 * 4;
  piVar5 = (int *)0x0;
  memset(__s,0,__n);
  pSVar2->vMarksCIO = pVVar3;
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar8 != 0) {
    piVar5 = (int *)malloc(__n);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar10;
  memset(piVar5,0,__n);
  pSVar2->vMarksIn = pVVar4;
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar8 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(__n);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar10;
  __s_00 = (int *)0x0;
  memset(piVar5,0,__n);
  pSVar2->vMarksNo = pVVar4;
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar8 != 0) {
    __s_00 = (int *)malloc(__n);
  }
  pVVar4->pArray = __s_00;
  pVVar4->nSize = iVar10;
  memset(__s_00,0,__n);
  pSVar2->vMarksAnd = pVVar4;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  pSVar2->vRoots = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  pSVar2->vNodes = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  pSVar2->vLeaves = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  pSVar2->vAnds = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  pSVar2->vFanouts = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  pSVar2->vCands = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  pSVar2->vInputs = pVVar6;
  if (iVar8 < 1) {
LAB_007d2715:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                  ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
  }
  *__s = *__s | 1;
  pVVar6 = pGia->vCis;
  if (0 < pVVar6->nSize) {
    piVar5 = pVVar6->pArray;
    lVar9 = 0;
    do {
      uVar1 = piVar5[lVar9];
      if (((int)uVar1 < 0) || (pGia->nObjs <= (int)uVar1)) goto LAB_007d26f6;
      if (uVar1 == 0) break;
      if (pVVar3->nSize <= (int)uVar1) goto LAB_007d2715;
      *(uint *)(__s + (ulong)(uVar1 >> 5) * 4) =
           *(uint *)(__s + (ulong)(uVar1 >> 5) * 4) | 1 << ((byte)uVar1 & 0x1f);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = pGia->vCos;
  if (0 < pVVar6->nSize) {
    piVar5 = pVVar6->pArray;
    lVar9 = 0;
    do {
      uVar1 = piVar5[lVar9];
      if (((int)uVar1 < 0) || (pGia->nObjs <= (int)uVar1)) {
LAB_007d26f6:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar1 == 0) break;
      if (pVVar3->nSize <= (int)uVar1) goto LAB_007d2715;
      *(uint *)(__s + (ulong)(uVar1 >> 5) * 4) =
           *(uint *)(__s + (ulong)(uVar1 >> 5) * 4) | 1 << ((byte)uVar1 & 0x1f);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  Gia_ManSetLutRefs(pGia);
  if (pGia->vMapping != (Vec_Int_t *)0x0) {
    if (pGia->vMapping2 == (Vec_Wec_t *)0x0) {
      pVVar7 = Spl_ManToWecMapping(pGia);
      pGia->vMapping2 = pVVar7;
      if (pGia->vMapping != (Vec_Int_t *)0x0) {
        piVar5 = pGia->vMapping->pArray;
        if (piVar5 != (int *)0x0) {
          free(piVar5);
          pGia->vMapping->pArray = (int *)0x0;
        }
        if (pGia->vMapping != (Vec_Int_t *)0x0) {
          free(pGia->vMapping);
          pGia->vMapping = (Vec_Int_t *)0x0;
        }
      }
      Gia_ManStaticFanoutStart(pGia);
      return pSVar2;
    }
    __assert_fail("!Gia_ManHasMapping2(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x8d,"Spl_Man_t *Spl_ManAlloc(Gia_Man_t *, int, int)");
  }
  __assert_fail("Gia_ManHasMapping(pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                ,0x8c,"Spl_Man_t *Spl_ManAlloc(Gia_Man_t *, int, int)");
}

Assistant:

Spl_Man_t * Spl_ManAlloc( Gia_Man_t * pGia, int Limit, int fReverse )
{
    int i, iObj;
    Spl_Man_t * p = ABC_CALLOC( Spl_Man_t, 1 );
    p->pGia       = pGia;
    p->Limit      = Limit;
    p->fReverse   = fReverse;
    // intermediate
    p->vMarksCIO  = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksIn   = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksNo   = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksAnd  = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vRoots     = Vec_IntAlloc( 100 );
    p->vNodes     = Vec_IntAlloc( 100 );
    p->vLeaves    = Vec_IntAlloc( 100 );
    p->vAnds      = Vec_IntAlloc( 100 );
    // temporary 
    p->vFanouts   = Vec_IntAlloc( 100 );
    p->vCands     = Vec_IntAlloc( 100 );
    p->vInputs    = Vec_IntAlloc( 100 );
    // mark CIs/COs
    Vec_BitWriteEntry( p->vMarksCIO, 0, 1 );
    Gia_ManForEachCiId( pGia, iObj, i )
        Vec_BitWriteEntry( p->vMarksCIO, iObj, 1 );
    Gia_ManForEachCoId( pGia, iObj, i )
        Vec_BitWriteEntry( p->vMarksCIO, iObj, 1 );
    // mapping
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManSetLutRefs( pGia );
    assert( Gia_ManHasMapping(pGia) );
    assert( !Gia_ManHasMapping2(pGia) );
    pGia->vMapping2 = Spl_ManToWecMapping( pGia );
    Vec_IntFreeP( &pGia->vMapping );
    // fanout
    Gia_ManStaticFanoutStart( pGia );
    return p;
}